

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_error.h
# Opt level: O2

void __thiscall
jsonnet::internal::StaticError::StaticError
          (StaticError *this,string *filename,Location *location,string *msg)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  
  uVar1 = location->line;
  uVar2 = location->column;
  std::__cxx11::string::string((string *)this,(string *)filename);
  uVar3 = location->column;
  (this->location).begin.line = location->line;
  (this->location).begin.column = uVar3;
  (this->location).end.line = uVar1;
  (this->location).end.column = uVar2 + 1;
  std::__cxx11::string::string((string *)&this->msg,(string *)msg);
  return;
}

Assistant:

StaticError(const std::string &filename, const Location &location, const std::string &msg)
        : location(filename, location, location.successor()), msg(msg)
    {
    }